

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O3

string * set_xterm256_foreground_abi_cxx11_(string *__return_storage_ptr__,int r,int g,int b)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  int iVar7;
  ostringstream oss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  iVar2 = (int)((double)b * 0.114 + (double)r * 0.299 + (double)g * 0.587 + 0.5);
  iVar7 = 0x17;
  if (iVar2 < 0xef) {
    iVar7 = (iVar2 + -3) / 10;
  }
  uVar3 = 1;
  if (0x72 < r) {
    uVar3 = (ulong)(r - 0x23) / 0x28;
  }
  iVar2 = iVar7 * 10 + 8;
  uVar6 = 0;
  if ((0x2f < g) && (uVar6 = 1, 0x72 < (uint)g)) {
    uVar6 = (ulong)(g - 0x23) / 0x28;
  }
  uVar1 = 2 - ((uint)b < 0x73);
  if (b < 0x30) {
    uVar1 = 0;
  }
  if ((uint)((iVar2 - b) * (iVar2 - b) + (iVar2 - g) * (iVar2 - g) + (iVar2 - r) * (iVar2 - r)) <
      ((uint)(byte)(&DAT_0021d0e0)[uVar1] - b) * ((uint)(byte)(&DAT_0021d0e0)[uVar1] - b) +
      ((uint)(byte)(&DAT_0021d0e0)[uVar6] - g) * ((uint)(byte)(&DAT_0021d0e0)[uVar6] - g) +
      ((uint)(byte)(&DAT_0021d0e0)[uVar3] - r) * ((uint)(byte)(&DAT_0021d0e0)[uVar3] - r)) {
    iVar7 = iVar7 + 0xe8;
  }
  else {
    iVar7 = uVar1 + (int)uVar3 * 0x24 + (int)uVar6 * 6 + 0x10;
  }
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,"\x1b[38;5;",7);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)aoStack_198,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"m",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  psVar5 = (string *)std::ios_base::~ios_base(local_128);
  return psVar5;
}

Assistant:

static std::string set_xterm256_foreground(int r, int g, int b) {
    int x = rgb2xterm256(r, g, b);
    std::ostringstream oss;
    oss << "\033[38;5;" << x << "m";
    return oss.str();
}